

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void __thiscall Search::BaseTask::Run(BaseTask *this)

{
  bool bVar1;
  search_private *psVar2;
  stringstream *psVar3;
  float local_58;
  float local_54;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  psVar2 = this->sch->priv;
  bVar1 = psVar2->should_produce_string;
  if ((this->_final_run == false) &&
     (this->_with_output_string == (_func_void_search_ptr_stringstream_ptr *)0x0)) {
    psVar2->should_produce_string = false;
    local_54 = psVar2->test_loss;
    psVar2->learn_loss = psVar2->learn_loss * 0.5;
    local_58 = psVar2->train_loss;
  }
  else {
    local_54 = psVar2->test_loss;
    psVar2->learn_loss = psVar2->learn_loss * 0.5;
    local_58 = psVar2->train_loss;
    if (bVar1 != false) {
      psVar3 = psVar2->pred_string;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
      std::__cxx11::stringbuf::str((string *)(psVar3 + 0x18));
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
    }
  }
  psVar2->t = 0;
  psVar2->metaoverride = this;
  (*psVar2->task->run)(this->sch,this->ec);
  psVar2->metaoverride = (BaseTask *)0x0;
  psVar2->meta_t = psVar2->meta_t + psVar2->t;
  if ((this->_with_output_string != (_func_void_search_ptr_stringstream_ptr *)0x0 & bVar1) == 1) {
    (*this->_with_output_string)(this->sch,psVar2->pred_string);
  }
  psVar2->should_produce_string = bVar1;
  if (this->_final_run == false) {
    psVar2->test_loss = local_54;
    psVar2->train_loss = local_58;
  }
  return;
}

Assistant:

void BaseTask::Run()
{
  search_private& priv = *sch->priv;
  // make sure output is correct
  bool old_should_produce_string = priv.should_produce_string;
  if (!_final_run && !_with_output_string)
    priv.should_produce_string = false;
  // if this isn't a final run, it shouldn't count for loss
  float old_test_loss = priv.test_loss;
  // float old_learn_loss = priv.learn_loss;
  priv.learn_loss *= 0.5;
  float old_train_loss = priv.train_loss;

  if (priv.should_produce_string)
    priv.pred_string->str("");

  priv.t = 0;
  priv.metaoverride = this;
  priv.task->run(*sch, ec);
  priv.metaoverride = nullptr;
  priv.meta_t += priv.t;

  // restore
  if (_with_output_string && old_should_produce_string)
    _with_output_string(*sch, *priv.pred_string);

  priv.should_produce_string = old_should_produce_string;
  if (!_final_run)
  {
    priv.test_loss = old_test_loss;
    // priv.learn_loss = old_learn_loss;
    priv.train_loss = old_train_loss;
  }
}